

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_float_push_back(ImVector_float *self,float v)

{
  float local_14;
  ImVector_float *pIStack_10;
  float v_local;
  ImVector_float *self_local;
  
  local_14 = v;
  pIStack_10 = self;
  ImVector<float>::push_back(self,&local_14);
  return;
}

Assistant:

CIMGUI_API void ImVector_float_push_back(ImVector_float* self,const float v)
{
    return self->push_back(v);
}